

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigInd.c
# Opt level: O3

int Saig_ManInduction(Aig_Man_t *p,int nTimeOut,int nFramesMax,int nConfMax,int fUnique,
                     int fUniqueAll,int fGetCex,int fVerbose,int fVeryVerbose)

{
  ABC_INT64_T AVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  uint *puVar10;
  void *pvVar11;
  sat_solver *s;
  Cnf_Dat_t *pCVar12;
  Abc_Cex_t *pAVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  char cVar18;
  int iVar19;
  uint k;
  Aig_Man_t *pAVar20;
  long lVar21;
  uint uVar22;
  int *piVar23;
  uint uVar24;
  char *__format;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  uint local_fc;
  int nClauses;
  ulong local_d8;
  ulong local_d0;
  uint *local_c8;
  Cnf_Dat_t *local_c0;
  Vec_Int_t *local_b8;
  int nSatVarNum;
  int Lits [2];
  Vec_Ptr_t *local_a0;
  Vec_Ptr_t *local_98;
  int *local_90;
  ulong local_88;
  uint local_80;
  int local_7c;
  Aig_Man_t *local_78;
  timespec ts;
  long local_58;
  long local_48;
  
  nClauses = 0;
  if (nTimeOut == 0) {
    local_58 = 0;
  }
  else {
    iVar3 = clock_gettime(3,(timespec *)&ts);
    if (iVar3 < 0) {
      local_58 = -1;
    }
    else {
      local_58 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    local_58 = local_58 + (long)nTimeOut * 1000000;
  }
  if (fUniqueAll != 0 && fUnique != 0) {
    __assert_fail("fUnique == 0 || fUniqueAll == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xa0,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  local_7c = fUnique;
  if (p->nTruePos != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xa1,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  Aig_ManSetCioIds(p);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar7->pArray = ppvVar6;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(4000);
  pVVar8->pArray = piVar9;
  if (p->vCos->nSize < 1) {
LAB_006ea211:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar11 = *p->vCos->pArray;
  pVVar7->nSize = 1;
  *ppvVar6 = pvVar11;
  puVar10 = (uint *)malloc(0x10);
  puVar10[0] = 100;
  puVar10[1] = 0;
  pvVar11 = malloc(400);
  *(void **)(puVar10 + 2) = pvVar11;
  local_c8 = puVar10;
  s = sat_solver_new();
  sat_solver_setnvars(s,1000);
  if (local_58 != 0) {
    s->nRuntimeLimit = local_58;
  }
  nSatVarNum = 0;
  if (fVerbose != 0) {
    printf("Induction parameters: FramesMax = %5d. ConflictMax = %6d.\n",nFramesMax,
           (ulong)(uint)nConfMax);
  }
  local_80 = nFramesMax - 1;
  local_fc = 0;
  local_d8 = 0;
  local_78 = (Aig_Man_t *)0x0;
  pCVar12 = (Cnf_Dat_t *)0x0;
  piVar9 = (int *)0x0;
  local_b8 = pVVar8;
  local_a0 = pVVar5;
  local_98 = pVVar7;
LAB_006e936e:
  pVVar5 = local_a0;
  if (local_fc != 0) {
    Aig_ManStop(local_78);
    Cnf_DataFree(pCVar12);
  }
  iVar3 = clock_gettime(3,(timespec *)&ts);
  pVVar7 = local_98;
  if (iVar3 < 0) {
    local_48 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_48 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  local_90 = piVar9;
  Aig_SupportNodes(p,(Aig_Obj_t **)local_98->pArray,local_98->nSize,pVVar5);
  local_78 = Aig_ManDupSimpleDfsPart(p,pVVar5,pVVar7);
  pCVar12 = Cnf_Derive(local_78,local_78->nObjs[3]);
  iVar3 = nSatVarNum;
  Cnf_DataLift(pCVar12,nSatVarNum);
  nSatVarNum = iVar3 + pCVar12->nVars;
  nClauses = nClauses + pCVar12->nClauses;
  local_c0 = pCVar12;
  if (local_90 == (int *)0x0 && fGetCex != 0) {
    iVar3 = p->nObjs[2];
    piVar9 = (int *)malloc(0x10);
    iVar4 = iVar3;
    if (iVar3 - 1U < 0xf) {
      iVar4 = 0x10;
    }
    *piVar9 = iVar4;
    if (iVar4 == 0) {
      piVar9[2] = 0;
      piVar9[3] = 0;
      piVar9[1] = iVar3;
LAB_006e94e5:
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = malloc((long)iVar4 << 2);
      *(void **)(piVar9 + 2) = pvVar11;
      piVar9[1] = iVar3;
      if (pvVar11 == (void *)0x0) goto LAB_006e94e5;
      memset(pvVar11,0xff,(long)iVar3 << 2);
    }
    pVVar5 = p->vCis;
    local_90 = piVar9;
    if (0 < pVVar5->nSize) {
      ppvVar6 = pVVar5->pArray;
      lVar16 = 0;
      do {
        piVar23 = (int *)ppvVar6[lVar16];
        lVar21 = *(long *)(piVar23 + 10);
        if (lVar21 != 0) {
          if ((*(uint *)(lVar21 + 0x18) & 7) != 2) {
            __assert_fail("Aig_ObjIsCi(pObjPiCopy)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0xd3,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          if ((piVar23[6] & 7U) != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0xd8,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          iVar3 = *piVar23;
          uVar25 = iVar3 - p->nTruePis;
          if (iVar3 < p->nTruePis) {
            uVar25 = iVar3 + p->nRegs;
            if (((int)uVar25 < 0) || (piVar9[1] <= (int)uVar25)) goto LAB_006ea1f2;
            piVar23 = local_c0->pVarNums + *(int *)(lVar21 + 0x24);
          }
          else {
            if (((int)uVar25 < 0) || (piVar9[1] <= (int)uVar25)) goto LAB_006ea1f2;
            piVar23 = local_c0->pVarNums + *(int *)(lVar21 + 0x24);
          }
          *(int *)((long)pvVar11 + (ulong)uVar25 * 4) = *piVar23;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < pVVar5->nSize);
    }
  }
  local_d0 = (long)local_78->nObjs[3] - 1;
  if ((uint)local_d0 != local_c8[1]) {
    __assert_fail("Aig_ManCoNum(pAigPart)-1 == Vec_IntSize(vTopVarNums)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xdd,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  pVVar5 = local_78->vCos;
  pVVar7 = local_98;
  iVar3 = nClauses;
  if (0 < pVVar5->nSize) {
    local_88 = (ulong)(local_fc != 0);
    lVar16 = 0;
    pAVar20 = local_78;
    do {
      pCVar12 = local_c0;
      pvVar11 = pVVar5->pArray[lVar16];
      if (lVar16 == 0) {
        Lits[0] = (int)local_88 + local_c0->pVarNums[*(int *)((long)pvVar11 + 0x24)] * 2;
        iVar4 = sat_solver_addclause(s,Lits,Lits + 1);
        iVar15 = 1;
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xe8,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
      }
      else {
        if ((long)local_d0 < lVar16) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar21 = *(long *)(local_c8 + 2);
        Lits[0] = *(int *)(lVar21 + -4 + lVar16 * 4) * 2;
        Lits[1] = local_c0->pVarNums[*(int *)((long)pvVar11 + 0x24)] * 2 + 1;
        iVar4 = sat_solver_addclause(s,Lits,(lit *)&local_a0);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xef,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        Lits[0] = *(int *)(lVar21 + -4 + lVar16 * 4) * 2 + 1;
        Lits[1] = pCVar12->pVarNums[*(int *)((long)pvVar11 + 0x24)] * 2;
        iVar4 = sat_solver_addclause(s,Lits,(lit *)&local_a0);
        iVar15 = 2;
        pAVar20 = local_78;
        pVVar7 = local_98;
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xf3,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
      }
      iVar3 = iVar3 + iVar15;
      lVar16 = lVar16 + 1;
      pVVar5 = pAVar20->vCos;
    } while (lVar16 < pVVar5->nSize);
  }
  pVVar5 = local_a0;
  pVVar8 = local_b8;
  lVar16 = 0;
  nClauses = iVar3;
  do {
    lVar21 = lVar16;
    iVar3 = local_c0->nClauses;
    if (iVar3 <= lVar21) goto LAB_006e974a;
    iVar3 = sat_solver_addclause(s,local_c0->pClauses[lVar21],local_c0->pClauses[lVar21 + 1]);
    lVar16 = lVar21 + 1;
  } while (iVar3 != 0);
  iVar3 = local_c0->nClauses;
LAB_006e974a:
  iVar4 = 1;
  if ((int)lVar21 < iVar3) {
    cVar18 = '\0';
LAB_006e9eeb:
    if (fVerbose == 0) goto LAB_006e9fd9;
    if (local_58 == 0) {
LAB_006e9f7c:
      if (cVar18 == '\0') {
        uVar26 = (ulong)(local_fc + 1);
        if (fUniqueAll == 0 && local_7c == 0) {
          printf("Completed %d iterations.\n",uVar26);
          goto LAB_006e9fd9;
        }
        __format = "Completed %d iterations and added %d uniqueness constraints.\n";
        uVar17 = local_d8;
      }
      else {
        __format = "Conflict limit (%d) was reached during iteration %d.\n";
        uVar26 = (ulong)(uint)nConfMax;
        uVar17 = (ulong)(local_fc + 1);
      }
    }
    else {
      iVar3 = clock_gettime(3,(timespec *)&ts);
      if (iVar3 < 0) {
        lVar16 = -1;
      }
      else {
        lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      if (lVar16 < local_58) goto LAB_006e9f7c;
      uVar17 = (ulong)(local_fc + 1);
      __format = "Timeout (%d sec) was reached during iteration %d.\n";
      uVar26 = (ulong)(uint)nTimeOut;
    }
    printf(__format,uVar26,uVar17);
LAB_006e9fd9:
    sat_solver_delete(s);
    Aig_ManStop(local_78);
    Cnf_DataFree(local_c0);
    if (*(void **)(local_c8 + 2) != (void *)0x0) {
      free(*(void **)(local_c8 + 2));
    }
    free(local_c8);
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
    }
    free(pVVar7);
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
    }
    free(pVVar5);
    piVar9 = local_90;
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
    }
    free(pVVar8);
    if (piVar9 != (int *)0x0) {
      if (*(void **)(piVar9 + 2) != (void *)0x0) {
        free(*(void **)(piVar9 + 2));
        piVar9[2] = 0;
        piVar9[3] = 0;
      }
      free(piVar9);
    }
    return iVar4;
  }
  pVVar7->nSize = 0;
  if (0 < p->vCos->nSize) {
    pvVar11 = *p->vCos->pArray;
    iVar3 = 0;
    ppvVar6 = pVVar7->pArray;
    if (pVVar7->nCap == 0) {
      if (ppvVar6 == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
        iVar3 = 0;
      }
      else {
        ppvVar6 = (void **)realloc(ppvVar6,0x80);
        iVar3 = pVVar7->nSize;
      }
      pVVar7->pArray = ppvVar6;
      pVVar7->nCap = 0x10;
    }
    pVVar7->nSize = iVar3 + 1;
    ppvVar6[iVar3] = pvVar11;
    local_c8[1] = 0;
    uVar25 = pVVar8->nSize;
    uVar26 = (ulong)uVar25;
    iVar3 = p->nRegs;
    local_d0 = uVar26;
    if (0 < iVar3) {
      iVar15 = iVar3 + uVar25;
      iVar4 = pVVar8->nCap;
      iVar19 = iVar4 * 2;
      piVar9 = pVVar8->pArray;
      local_88 = CONCAT44(local_88._4_4_,iVar15);
      if (iVar19 < iVar15) {
        if (iVar4 < iVar15) {
          if (piVar9 == (int *)0x0) {
            piVar9 = (int *)malloc((long)iVar15 << 2);
          }
          else {
            piVar9 = (int *)realloc(piVar9,(long)iVar15 << 2);
          }
          pVVar8->pArray = piVar9;
          iVar19 = (int)local_88;
LAB_006e9868:
          uVar25 = (uint)local_d0;
          if (piVar9 == (int *)0x0) {
LAB_006ea366:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar8->nCap = iVar19;
        }
      }
      else if (iVar4 < iVar15) {
        if (piVar9 == (int *)0x0) {
          piVar9 = (int *)malloc((long)iVar4 << 3);
        }
        else {
          piVar9 = (int *)realloc(piVar9,(long)iVar4 << 3);
        }
        pVVar8->pArray = piVar9;
        goto LAB_006e9868;
      }
      memset(piVar9 + (int)uVar25,0xff,(ulong)(iVar3 - 1) * 4 + 4);
      uVar26 = local_88 & 0xffffffff;
      pVVar8->nSize = (int)local_88;
    }
    iVar3 = pVVar5->nSize;
    if (0 < iVar3) {
      lVar16 = 0;
      puVar10 = local_c8;
      uVar17 = local_d0;
      pCVar12 = local_c0;
      do {
        piVar9 = (int *)pVVar5->pArray[lVar16];
        if ((piVar9[6] & 7U) != 2) {
          __assert_fail("Aig_ObjIsCi(pObjPi)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0x109,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        if (p->nTruePis <= *piVar9) {
          lVar21 = *(long *)(piVar9 + 10);
          if (lVar21 == 0) {
            __assert_fail("pObjPiCopy != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0x10d,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          uVar25 = (*piVar9 - p->nTruePis) + p->nTruePos;
          if (((int)uVar25 < 0) || (p->vCos->nSize <= (int)uVar25)) goto LAB_006ea211;
          pvVar11 = p->vCos->pArray[uVar25];
          uVar25 = pVVar7->nSize;
          if (uVar25 == pVVar7->nCap) {
            if ((int)uVar25 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar6;
              pVVar7->nCap = 0x10;
              puVar10 = local_c8;
              uVar17 = local_d0;
              pCVar12 = local_c0;
            }
            else {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar25 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar25 << 4);
              }
              pVVar7->pArray = ppvVar6;
              pVVar7->nCap = uVar25 * 2;
              puVar10 = local_c8;
              uVar17 = local_d0;
              pCVar12 = local_c0;
            }
          }
          else {
            ppvVar6 = pVVar7->pArray;
          }
          iVar3 = pVVar7->nSize;
          pVVar7->nSize = iVar3 + 1;
          ppvVar6[iVar3] = pvVar11;
          iVar3 = pCVar12->pVarNums[*(int *)(lVar21 + 0x24)];
          uVar25 = puVar10[1];
          if (uVar25 == *puVar10) {
            if ((int)uVar25 < 0x10) {
              if (*(void **)(puVar10 + 2) == (void *)0x0) {
                pvVar11 = malloc(0x40);
              }
              else {
                pvVar11 = realloc(*(void **)(puVar10 + 2),0x40);
              }
              *(void **)(local_c8 + 2) = pvVar11;
              if (pvVar11 == (void *)0x0) goto LAB_006ea366;
              *local_c8 = 0x10;
              puVar10 = local_c8;
              uVar17 = local_d0;
              pCVar12 = local_c0;
            }
            else {
              if (*(void **)(puVar10 + 2) == (void *)0x0) {
                pvVar11 = malloc((ulong)uVar25 * 8);
              }
              else {
                pvVar11 = realloc(*(void **)(puVar10 + 2),(ulong)uVar25 * 8);
              }
              *(void **)(local_c8 + 2) = pvVar11;
              if (pvVar11 == (void *)0x0) goto LAB_006ea366;
              *local_c8 = uVar25 * 2;
              puVar10 = local_c8;
              uVar17 = local_d0;
              pCVar12 = local_c0;
            }
          }
          else {
            pvVar11 = *(void **)(puVar10 + 2);
          }
          puVar10[1] = uVar25 + 1;
          *(int *)((long)pvVar11 + (long)(int)uVar25 * 4) = iVar3;
          iVar3 = *piVar9 - p->nTruePis;
          if ((iVar3 < 0) || (p->nRegs <= iVar3)) {
            __assert_fail("iReg >= 0 && iReg < Aig_ManRegNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0x112,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          uVar25 = iVar3 + (int)uVar17;
          if (((int)uVar25 < 0) ||
             (uVar26 = (ulong)(uint)local_b8->nSize, local_b8->nSize <= (int)uVar25)) {
LAB_006ea1f2:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          local_b8->pArray[uVar25] = pCVar12->pVarNums[*(int *)(lVar21 + 0x24)];
          iVar3 = local_a0->nSize;
          pVVar7 = local_98;
          pVVar5 = local_a0;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar3);
    }
    pVVar8 = local_b8;
    iVar3 = (int)uVar26;
    uVar25 = iVar3 / p->nRegs;
    if (iVar3 % p->nRegs != 0) {
      __assert_fail("Vec_IntSize(vState)%Aig_ManRegNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0x116,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    local_88 = CONCAT44(local_88._4_4_,iVar3);
    if ((fUniqueAll != 0) && (2 < (int)uVar25)) {
      iVar3 = (int)local_d8;
      uVar14 = 1;
LAB_006e9b12:
      if (fVeryVerbose != 0) {
        printf("Adding constaint for state %2d and state %2d.\n",(ulong)uVar14,(ulong)(uVar25 - 1));
      }
      iVar4 = Saig_ManAddUniqueness
                        (s,pVVar8,p->nRegs,uVar14,uVar25 - 1,&nSatVarNum,&nClauses,fVerbose);
      if (iVar4 == 0) goto code_r0x006e9b69;
      uVar14 = (int)local_d8 + uVar14;
LAB_006e9ee1:
      local_d8 = (ulong)uVar14;
      cVar18 = '\0';
      iVar4 = 1;
      pVVar7 = local_98;
      pVVar5 = local_a0;
      goto LAB_006e9eeb;
    }
    goto LAB_006e9b95;
  }
  goto LAB_006ea211;
code_r0x006e9b69:
  iVar4 = uVar14 - uVar25;
  uVar14 = uVar14 + 1;
  if (iVar4 == -2) goto code_r0x006e9b7c;
  goto LAB_006e9b12;
code_r0x006e9b7c:
  local_d8 = (ulong)((iVar3 + uVar25) - 2);
  uVar26 = local_88 & 0xffffffff;
  pVVar7 = local_98;
LAB_006e9b95:
  bVar27 = local_7c != 0;
  bVar28 = local_fc == local_80;
  uVar14 = (uint)local_d8;
  uVar17 = local_d8 & 0xffffffff;
  local_d0 = uVar26;
LAB_006e9bdc:
  AVar1 = (s->stats).conflicts;
  iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)nConfMax,0,0,0);
  if (fVerbose != 0) {
    iVar4 = 0xa3b727;
    printf("Frame %4d : PI =%5d. PO =%5d. AIG =%5d. Var =%7d. Clau =%7d. Conf =%7d. ",
           (ulong)local_fc,(ulong)(uint)local_78->nObjs[2],(ulong)(uint)local_78->nObjs[3],
           (ulong)(uint)(local_78->nObjs[6] + local_78->nObjs[5]),(ulong)(uint)nSatVarNum,
           (ulong)(uint)nClauses,(ulong)(uint)((int)(s->stats).conflicts - (int)AVar1));
    Abc_Print(iVar4,"%s =","Time");
    iVar15 = 3;
    iVar4 = clock_gettime(3,(timespec *)&ts);
    if (iVar4 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar16 + local_48) / 1000000.0);
  }
  if (iVar3 != 1) {
    if (iVar3 == -1) {
      cVar18 = '\0';
      local_d8 = (ulong)uVar14;
      iVar4 = 1;
      pVVar8 = local_b8;
      pVVar5 = local_a0;
    }
    else {
      if (iVar3 != 0) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                      ,0x13c,
                      "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
      }
      iVar3 = 1;
      local_d8 = (ulong)uVar14;
LAB_006ea1e8:
      iVar4 = -1;
      cVar18 = (char)iVar3;
      pVVar8 = local_b8;
      pVVar5 = local_a0;
    }
    goto LAB_006e9eeb;
  }
  if (fVeryVerbose != 0) {
    if (0 < (int)local_88) {
      piVar9 = local_b8->pArray;
      uVar26 = 0;
      do {
        uVar24 = piVar9[uVar26];
        iVar3 = p->nRegs;
        if (uVar26 == 0) {
          iVar4 = 0;
        }
        else {
          iVar4 = (int)uVar26;
          if ((int)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | uVar26 & 0xffffffff) % (long)iVar3
                   ) == 0) {
            putchar(10);
            iVar3 = p->nRegs;
          }
        }
        if (iVar4 % iVar3 == 0) {
          printf("       State %3d : ");
        }
        if ((int)uVar24 < 0) {
          uVar24 = 0x78;
        }
        else {
          if (s->size <= (int)uVar24) goto LAB_006ea309;
          uVar24 = s->model[uVar24] == 1 | 0x30;
        }
        putchar(uVar24);
        uVar26 = uVar26 + 1;
      } while (local_d0 != uVar26);
    }
    putchar(10);
  }
  if (bVar28 && nFramesMax != 0) {
    iVar3 = 0;
    if (fGetCex == 0) {
      local_fc = local_80;
      goto LAB_006ea1e8;
    }
    pAVar13 = Abc_CexAlloc(p->nRegs + -1,p->nTruePis,1);
    pVVar5 = local_a0;
    pVVar8 = local_b8;
    pAVar13->iPo = 0;
    pAVar13->iFrame = 0;
    iVar4 = local_90[1];
    if (1 < iVar4) {
      lVar16 = *(long *)(local_90 + 2);
      lVar21 = 1;
      do {
        iVar3 = *(int *)(lVar16 + lVar21 * 4);
        if (-1 < (long)iVar3) {
          if (s->size <= iVar3) {
LAB_006ea309:
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (s->model[iVar3] == 1) {
            (&pAVar13[1].iPo)[lVar21 - 1U >> 5 & 0x7ffffff] =
                 (&pAVar13[1].iPo)[lVar21 - 1U >> 5 & 0x7ffffff] | 1 << ((byte)(lVar21 - 1U) & 0x1f)
            ;
            iVar4 = local_90[1];
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < iVar4);
      iVar3 = (int)lVar21 + -1;
    }
    if (iVar3 != pAVar13->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0x15a,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    Abc_CexFree(p->pSeqModel);
    p->pSeqModel = pAVar13;
    cVar18 = '\0';
    local_fc = local_80;
    iVar4 = -1;
    goto LAB_006e9eeb;
  }
  if (1 < (int)uVar25 && bVar27) goto code_r0x006e9dd5;
  uVar14 = (uint)uVar17;
  if (local_7c == 0) {
    uVar14 = (uint)local_d8;
  }
  goto LAB_006e9ea5;
code_r0x006e9dd5:
  bVar2 = false;
  uVar24 = 1;
  do {
    uVar22 = uVar24 + 1;
    k = uVar22;
    if ((int)uVar22 < (int)uVar25) {
      do {
        iVar3 = Saig_ManStatesAreEqual(s,local_b8,p->nRegs,uVar24,k);
        if (iVar3 != 0) {
          if (fVeryVerbose != 0) {
            printf("Adding constaint for state %2d and state %2d.\n",(ulong)uVar24,(ulong)k);
          }
          uVar14 = uVar14 + 1;
          uVar17 = (ulong)uVar14;
          iVar3 = Saig_ManAddUniqueness(s,local_b8,p->nRegs,uVar24,k,&nSatVarNum,&nClauses,fVerbose)
          ;
          bVar2 = true;
          pVVar8 = local_b8;
          if (iVar3 != 0) goto LAB_006e9ee1;
        }
        k = k + 1;
      } while (uVar25 != k);
    }
    uVar24 = uVar22;
  } while (uVar22 != uVar25);
  pVVar7 = local_98;
  if (!bVar2) goto LAB_006e9ea5;
  goto LAB_006e9bdc;
LAB_006e9ea5:
  local_fc = local_fc + 1;
  local_d8 = (ulong)uVar14;
  pCVar12 = local_c0;
  piVar9 = local_90;
  goto LAB_006e936e;
}

Assistant:

int Saig_ManInduction( Aig_Man_t * p, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose )
{
    sat_solver * pSat;
    Aig_Man_t * pAigPart = NULL;
    Cnf_Dat_t * pCnfPart = NULL;
    Vec_Int_t * vTopVarNums, * vState, * vTopVarIds = NULL;
    Vec_Ptr_t * vTop, * vBot;
    Aig_Obj_t * pObjPi, * pObjPiCopy, * pObjPo;
    int i, k, f, Lits[2], status = -1, RetValue, nSatVarNum, nConfPrev;
    int nOldSize, iReg, iLast, fAdded, nConstrs = 0, nClauses = 0;
    abctime clk, nTimeToStop = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    assert( fUnique == 0 || fUniqueAll == 0 );
    assert( Saig_ManPoNum(p) == 1 );
    Aig_ManSetCioIds( p );

    // start the top by including the PO
    vBot = Vec_PtrAlloc( 100 );
    vTop = Vec_PtrAlloc( 100 );
    vState = Vec_IntAlloc( 1000 );
    Vec_PtrPush( vTop, Aig_ManCo(p, 0) );
    // start the array of CNF variables
    vTopVarNums = Vec_IntAlloc( 100 );
    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 1000 );

    // set runtime limit
    if ( nTimeToStop )
        sat_solver_set_runtime_limit( pSat, nTimeToStop );

    // iterate backward unrolling
    RetValue = -1;
    nSatVarNum = 0;
    if ( fVerbose )
        printf( "Induction parameters: FramesMax = %5d. ConflictMax = %6d.\n", nFramesMax, nConfMax );
    for ( f = 0; ; f++ )
    { 
        if ( f > 0 )
        {
            Aig_ManStop( pAigPart );
            Cnf_DataFree( pCnfPart );
        }
        clk = Abc_Clock();
        // get the bottom
        Aig_SupportNodes( p, (Aig_Obj_t **)Vec_PtrArray(vTop), Vec_PtrSize(vTop), vBot );
        // derive AIG for the part between top and bottom
        pAigPart = Aig_ManDupSimpleDfsPart( p, vBot, vTop );
        // convert it into CNF
        pCnfPart = Cnf_Derive( pAigPart, Aig_ManCoNum(pAigPart) );
        Cnf_DataLift( pCnfPart, nSatVarNum );
        nSatVarNum += pCnfPart->nVars;
        nClauses   += pCnfPart->nClauses;

        // remember top frame var IDs
        if ( fGetCex && vTopVarIds == NULL )
        {
            vTopVarIds = Vec_IntStartFull( Aig_ManCiNum(p) );
            Aig_ManForEachCi( p, pObjPi, i )
            {
                if ( pObjPi->pData == NULL )
                    continue;
                pObjPiCopy = (Aig_Obj_t *)pObjPi->pData;
                assert( Aig_ObjIsCi(pObjPiCopy) );
                if ( Saig_ObjIsPi(p, pObjPi) )
                    Vec_IntWriteEntry( vTopVarIds, Aig_ObjCioId(pObjPi) + Saig_ManRegNum(p), pCnfPart->pVarNums[Aig_ObjId(pObjPiCopy)] );
                else if ( Saig_ObjIsLo(p, pObjPi) )
                    Vec_IntWriteEntry( vTopVarIds, Aig_ObjCioId(pObjPi) - Saig_ManPiNum(p), pCnfPart->pVarNums[Aig_ObjId(pObjPiCopy)] );
                else assert( 0 );
            }
        }

        // stitch variables of top and bot
        assert( Aig_ManCoNum(pAigPart)-1 == Vec_IntSize(vTopVarNums) );
        Aig_ManForEachCo( pAigPart, pObjPo, i )
        {
            if ( i == 0 )
            {
                // do not perform inductive strengthening
//                if ( f > 0 )
//                    continue;
                // add topmost literal
                Lits[0] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], f>0 );
                if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
                    assert( 0 );
                nClauses++;
                continue;
            }
            Lits[0] = toLitCond( Vec_IntEntry(vTopVarNums, i-1), 0 );
            Lits[1] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], 1 );
            if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
                assert( 0 );
            Lits[0] = toLitCond( Vec_IntEntry(vTopVarNums, i-1), 1 );
            Lits[1] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], 0 );
            if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
                assert( 0 );
            nClauses += 2;
        }
        // add CNF to the SAT solver
        for ( i = 0; i < pCnfPart->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnfPart->pClauses[i], pCnfPart->pClauses[i+1] ) )
                break;
        if ( i < pCnfPart->nClauses )
        {
//            printf( "SAT solver became UNSAT after adding clauses.\n" );
            RetValue = 1;
            break;
        }

        // create new set of POs to derive new top
        Vec_PtrClear( vTop );
        Vec_PtrPush( vTop, Aig_ManCo(p, 0) );
        Vec_IntClear( vTopVarNums );
        nOldSize = Vec_IntSize(vState);
        Vec_IntFillExtra( vState, nOldSize + Aig_ManRegNum(p), -1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vBot, pObjPi, i )
        {
            assert( Aig_ObjIsCi(pObjPi) );
            if ( Saig_ObjIsLo(p, pObjPi) )
            {
                pObjPiCopy = (Aig_Obj_t *)pObjPi->pData;
                assert( pObjPiCopy != NULL );
                Vec_PtrPush( vTop, Saig_ObjLoToLi(p, pObjPi) );
                Vec_IntPush( vTopVarNums, pCnfPart->pVarNums[pObjPiCopy->Id] );

                iReg = pObjPi->CioId - Saig_ManPiNum(p);
                assert( iReg >= 0 && iReg < Aig_ManRegNum(p) );
                Vec_IntWriteEntry( vState, nOldSize+iReg, pCnfPart->pVarNums[pObjPiCopy->Id] );
            }
        } 
        assert( Vec_IntSize(vState)%Aig_ManRegNum(p) == 0 );
        iLast = Vec_IntSize(vState)/Aig_ManRegNum(p);
        if ( fUniqueAll )
        {
            for ( i = 1; i < iLast-1; i++ )
            {
                nConstrs++;
                if ( fVeryVerbose )
                    printf( "Adding constaint for state %2d and state %2d.\n", i, iLast-1 );
                if ( Saig_ManAddUniqueness( pSat, vState, Aig_ManRegNum(p), i, iLast-1, &nSatVarNum, &nClauses, fVerbose ) )
                    break;
            }
            if ( i < iLast-1 )
            {
                RetValue = 1;
                break;
            }
        }

nextrun:
        fAdded = 0;
        // run the SAT solver
        nConfPrev = pSat->stats.conflicts;
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfMax, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Frame %4d : PI =%5d. PO =%5d. AIG =%5d. Var =%7d. Clau =%7d. Conf =%7d. ",
                f, Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), Aig_ManNodeNum(pAigPart), 
                nSatVarNum, nClauses, (int)pSat->stats.conflicts-nConfPrev );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( status == l_Undef )
            break;
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        assert( status == l_True );
        // the problem is SAT - add more clauses
        if ( fVeryVerbose )
        {
            Vec_IntForEachEntry( vState, iReg, i )
            {
                if ( i && (i % Aig_ManRegNum(p)) == 0 )
                    printf( "\n" );
                if ( (i % Aig_ManRegNum(p)) == 0 )
                    printf( "       State %3d : ", i/Aig_ManRegNum(p) );
                printf( "%c", (iReg >= 0) ? ('0' + sat_solver_var_value(pSat, iReg)) : 'x' );
            }
            printf( "\n" );
        }
        if ( nFramesMax && f == nFramesMax - 1 )
        {
            // derive counter-example
            assert( status == l_True );
            if ( fGetCex )
            {
                int VarNum, iBit = 0;
                Abc_Cex_t * pCex = Abc_CexAlloc( Aig_ManRegNum(p)-1, Saig_ManPiNum(p), 1 );
                pCex->iFrame = 0;
                pCex->iPo = 0;
                Vec_IntForEachEntryStart( vTopVarIds, VarNum, i, 1 )
                {
                    if ( VarNum >= 0 && sat_solver_var_value( pSat, VarNum ) )
                        Abc_InfoSetBit( pCex->pData, iBit );
                    iBit++;
                }
                assert( iBit == pCex->nBits );
                Abc_CexFree( p->pSeqModel );
                p->pSeqModel = pCex;
            }
            break;
        }
        if ( fUnique )
        {
            for ( i = 1; i < iLast; i++ )
            {
                for ( k = i+1; k < iLast; k++ )
                {
                    if ( !Saig_ManStatesAreEqual( pSat, vState, Aig_ManRegNum(p), i, k ) )
                        continue;
                    nConstrs++;
                    fAdded = 1;
                    if ( fVeryVerbose )
                        printf( "Adding constaint for state %2d and state %2d.\n", i, k );
                    if ( Saig_ManAddUniqueness( pSat, vState, Aig_ManRegNum(p), i, k, &nSatVarNum, &nClauses, fVerbose ) )
                        break;
                }
                if ( k < iLast )
                    break;
            }
            if ( i < iLast )
            {
                RetValue = 1;
                break;
            }
        }
        if ( fAdded )
            goto nextrun;
    }
    if ( fVerbose )
    {
        if ( nTimeToStop && Abc_Clock() >= nTimeToStop )
            printf( "Timeout (%d sec) was reached during iteration %d.\n", nTimeOut, f+1 );
        else if ( status == l_Undef )
            printf( "Conflict limit (%d) was reached during iteration %d.\n", nConfMax, f+1 );
        else if ( fUnique || fUniqueAll )
            printf( "Completed %d iterations and added %d uniqueness constraints.\n", f+1, nConstrs );
        else
            printf( "Completed %d iterations.\n", f+1 );
    }
    // cleanup
    sat_solver_delete( pSat );
    Aig_ManStop( pAigPart );
    Cnf_DataFree( pCnfPart );
    Vec_IntFree( vTopVarNums );
    Vec_PtrFree( vTop );
    Vec_PtrFree( vBot );
    Vec_IntFree( vState );
    Vec_IntFreeP( &vTopVarIds );
    return RetValue;
}